

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baseline.cc
# Opt level: O0

void predict_or_learn<false>(baseline *data,single_learner *base,example *ec)

{
  bool bVar1;
  long in_RDX;
  baseline *in_RSI;
  example *in_RDI;
  example *in_stack_00000018;
  
  if ((((in_RDI->super_example_predict).indices.erase_count & 0x10000) != 0) &&
     (bVar1 = BASELINE::baseline_enabled(in_stack_00000018), !bVar1)) {
    LEARNER::learner<char,_example>::predict((learner<char,_example> *)ec,in_RDI,(size_t)in_RSI);
    return;
  }
  if (((in_RDI->super_example_predict).indices.erase_count & 1) == 0) {
    LEARNER::learner<char,_example>::predict((learner<char,_example> *)ec,in_RDI,(size_t)in_RSI);
  }
  else {
    if (((in_RDI->super_example_predict).indices.erase_count & 0x100) == 0) {
      init_global(in_RSI);
      *(undefined1 *)((long)&(in_RDI->super_example_predict).indices.erase_count + 1) = 1;
    }
    VW::copy_example_metadata(data._7_1_,(example *)base,ec);
    LEARNER::learner<char,_example>::predict((learner<char,_example> *)ec,in_RDI,(size_t)in_RSI);
    *(undefined4 *)(in_RDX + 0x6830) =
         *(undefined4 *)((in_RDI->super_example_predict).indices._begin + 0x6850);
    LEARNER::learner<char,_example>::predict((learner<char,_example> *)ec,in_RDI,(size_t)in_RSI);
  }
  return;
}

Assistant:

void predict_or_learn(baseline& data, single_learner& base, example& ec)
{
  // no baseline if check_enabled is true and example contains flag
  if (data.check_enabled && !BASELINE::baseline_enabled(&ec))
  {
    if (is_learn)
      base.learn(ec);
    else
      base.predict(ec);
    return;
  }

  // always do a full prediction, for safety in accurate predictive validation
  if (data.global_only)
  {
    if (!data.global_initialized)
    {
      init_global(data);
      data.global_initialized = true;
    }
    VW::copy_example_metadata(/*audit=*/false, data.ec, &ec);
    base.predict(*data.ec);
    ec.l.simple.initial = data.ec->pred.scalar;
    base.predict(ec);
  }
  else
    base.predict(ec);

  if (is_learn)
  {
    const float pred = ec.pred.scalar;  // save 'safe' prediction

    // now learn
    data.ec->l.simple = ec.l.simple;
    if (!data.global_only)
    {
      // move label & constant features data over to baseline example
      VW::copy_example_metadata(/*audit=*/false, data.ec, &ec);
      VW::move_feature_namespace(data.ec, &ec, constant_namespace);
    }

    // regress baseline on label
    if (data.lr_scaling)
    {
      float multiplier = data.lr_multiplier;
      if (multiplier == 0)
      {
        multiplier = max<float>(0.0001f, max<float>(abs(data.all->sd->min_label), abs(data.all->sd->max_label)));
        if (multiplier > max_multiplier)
          multiplier = max_multiplier;
      }
      data.all->eta *= multiplier;
      base.learn(*data.ec);
      data.all->eta /= multiplier;
    }
    else
      base.learn(*data.ec);

    // regress residual
    ec.l.simple.initial = data.ec->pred.scalar;
    base.learn(ec);

    if (!data.global_only)
    {
      // move feature data back to the original example
      VW::move_feature_namespace(&ec, data.ec, constant_namespace);
    }

    // return the safe prediction
    ec.pred.scalar = pred;
  }
}